

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::Next(DBIter *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Slice local_30;
  Slice local_20;
  DBIter *local_10;
  DBIter *this_local;
  
  local_10 = this;
  if ((this->valid_ & 1U) == 0) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_iter.cc"
                  ,0x8e,"virtual void leveldb::(anonymous namespace)::DBIter::Next()");
  }
  if (this->direction_ == kReverse) {
    this->direction_ = kForward;
    uVar1 = (*this->iter_->_vptr_Iterator[2])();
    if ((uVar1 & 1) == 0) {
      (*this->iter_->_vptr_Iterator[3])();
    }
    else {
      (*this->iter_->_vptr_Iterator[6])();
    }
    uVar1 = (*this->iter_->_vptr_Iterator[2])();
    if ((uVar1 & 1) == 0) {
      this->valid_ = false;
      std::__cxx11::string::clear();
      return;
    }
  }
  else {
    iVar2 = (*this->iter_->_vptr_Iterator[8])();
    local_30.data_ = (char *)CONCAT44(extraout_var,iVar2);
    local_20 = ExtractUserKey(&local_30);
    SaveKey(this,&local_20,&this->saved_key_);
    (*this->iter_->_vptr_Iterator[6])();
    uVar1 = (*this->iter_->_vptr_Iterator[2])();
    if ((uVar1 & 1) == 0) {
      this->valid_ = false;
      std::__cxx11::string::clear();
      return;
    }
  }
  FindNextUserEntry(this,true,&this->saved_key_);
  return;
}

Assistant:

void DBIter::Next() {
  assert(valid_);

  if (direction_ == kReverse) {  // Switch directions?
    direction_ = kForward;
    // iter_ is pointing just before the entries for this->key(),
    // so advance into the range of entries for this->key() and then
    // use the normal skipping code below.
    if (!iter_->Valid()) {
      iter_->SeekToFirst();
    } else {
      iter_->Next();
    }
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
    // saved_key_ already contains the key to skip past.
  } else {
    // Store in saved_key_ the current key so we skip it below.
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);

    // iter_ is pointing to current key. We can now safely move to the next to
    // avoid checking current key.
    iter_->Next();
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
  }

  FindNextUserEntry(true, &saved_key_);
}